

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O2

double __thiscall NetworkNS::RanMars::modified_gaussian(RanMars *this,double mean,double stdev)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double in_XMM3_Qa;
  double local_38;
  double dStack_30;
  
  if (this->save == 0) {
    bVar1 = false;
    while (!bVar1) {
      dVar3 = uniform(this);
      dVar4 = uniform(this);
      local_38 = dVar3 + dVar3 + -1.0;
      dStack_30 = dVar4 + dVar4 + -1.0;
      in_XMM3_Qa = local_38 * local_38 + dStack_30 * dStack_30;
      bVar1 = in_XMM3_Qa < 1.0 && in_XMM3_Qa != 0.0;
    }
    dVar3 = log(in_XMM3_Qa);
    dVar3 = (dVar3 * -2.0) / in_XMM3_Qa;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    this->second = local_38 * stdev * dVar3 + mean;
    dVar3 = dStack_30 * stdev * dVar3 + mean;
    iVar2 = 1;
  }
  else {
    dVar3 = this->second;
    iVar2 = 0;
  }
  this->save = iVar2;
  return dVar3;
}

Assistant:

double RanMars::modified_gaussian(double mean, double stdev) {
      double first, v1, v2, rsq, fac;

      if (!save) {
         int again = 1;
         while (again) {
            v1 = 2.0 * uniform() - 1.0;
            v2 = 2.0 * uniform() - 1.0;
            rsq = v1 * v1 + v2*v2;
            if (rsq < 1.0 && rsq != 0.0) again = 0;
         }
         fac = sqrt(-2.0 * log(rsq) / rsq);
         second = mean + stdev * v1*fac;
         first = mean + stdev * v2*fac;
         //cout << "in_marsaglia=" << mean << endl;
         save = 1;
      } else {
         first = second;
         save = 0;
      }
      return first;
   }